

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_smote(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  CHAR_DATA *pCVar6;
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var7;
  uint matches;
  char temp [4608];
  char last [4608];
  char *name;
  char *letter;
  CHAR_DATA *vch;
  CHAR_DATA *in_stack_ffffffffffffdb98;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  char *in_stack_ffffffffffffdbb0;
  uint local_242c;
  char local_2428 [4608];
  char local_1228 [4608];
  char *local_28;
  char *local_20;
  long local_18;
  char *local_10;
  long local_8;
  
  local_242c = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar2 = is_npc(in_stack_ffffffffffffdb98);
  if ((bVar2) ||
     (uVar1 = *(ulong *)(local_8 + 400), _Var7 = std::pow<int,int>(0,0x587233),
     (uVar1 & (long)_Var7) == 0)) {
    if (*local_10 == '\0') {
      send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
    }
    else {
      pcVar3 = strstr(local_10,*(char **)(local_8 + 0xe8));
      if ((pcVar3 != (char *)0x0) || (bVar2 = is_npc(in_stack_ffffffffffffdb98), bVar2)) {
        send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
        send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
        for (local_18 = *(long *)(*(long *)(local_8 + 0xa8) + 0x18); local_18 != 0;
            local_18 = *(long *)(local_18 + 8)) {
          if ((*(long *)(local_18 + 0x80) != 0) && (local_18 != local_8)) {
            local_20 = strstr(local_10,*(char **)(local_18 + 0xe8));
            if (local_20 == (char *)0x0) {
              send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
              send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
            }
            else {
              strcpy(local_2428,local_10);
              sVar4 = strlen(local_10);
              sVar5 = strlen(local_20);
              local_2428[sVar4 - sVar5] = '\0';
              local_1228[0] = '\0';
              local_28 = *(char **)(local_18 + 0xe8);
              for (; *local_20 != '\0'; local_20 = local_20 + 1) {
                if ((*local_20 == '\'') &&
                   (sVar4 = strlen(*(char **)(local_18 + 0xe8)), local_242c == sVar4)) {
                  strcat(local_2428,"r");
                }
                else {
                  if (*local_20 == 's') {
                    in_stack_ffffffffffffdbb0 = (char *)(ulong)local_242c;
                    pcVar3 = (char *)strlen(*(char **)(local_18 + 0xe8));
                    if (in_stack_ffffffffffffdbb0 == pcVar3) {
                      local_242c = 0;
                      goto LAB_005875ef;
                    }
                  }
                  in_stack_ffffffffffffdba8 = (CHAR_DATA *)(ulong)local_242c;
                  pCVar6 = (CHAR_DATA *)strlen(*(char **)(local_18 + 0xe8));
                  if (in_stack_ffffffffffffdba8 == pCVar6) {
                    local_242c = 0;
                  }
                  if (*local_20 == *local_28) {
                    local_242c = local_242c + 1;
                    local_28 = local_28 + 1;
                    sVar4 = strlen(*(char **)(local_18 + 0xe8));
                    if (local_242c == sVar4) {
                      strcat(local_2428,"you");
                      local_1228[0] = '\0';
                      local_28 = *(char **)(local_18 + 0xe8);
                    }
                    else {
                      strncat(local_1228,local_20,1);
                    }
                  }
                  else {
                    local_242c = 0;
                    strcat(local_2428,local_1228);
                    strncat(local_2428,local_20,1);
                    local_1228[0] = '\0';
                    local_28 = *(char **)(local_18 + 0xe8);
                  }
                }
LAB_005875ef:
              }
              send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
              send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
            }
          }
        }
      }
      else {
        send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
      }
    }
  }
  else {
    send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
  }
  return;
}

Assistant:

void do_smote(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *vch;
	char *letter, *name;
	char last[MAX_INPUT_LENGTH], temp[MAX_STRING_LENGTH];
	unsigned int matches = 0;

	if (!is_npc(ch) && IS_SET(ch->comm, COMM_NOEMOTE))
	{
		send_to_char("You can't show your emotions.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Emote what?\n\r", ch);
		return;
	}

	if (strstr(argument, ch->name) == nullptr && !is_npc(ch))
	{
		send_to_char("You must include your name in an smote.\n\r", ch);
		return;
	}

	send_to_char(argument, ch);
	send_to_char("\n\r", ch);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
	{
		if (vch->desc == nullptr || vch == ch)
			continue;

		letter = strstr(argument, vch->name);

		if (letter == nullptr)
		{
			send_to_char(argument, vch);
			send_to_char("\n\r", vch);
			continue;
		}

		strcpy(temp, argument);
		temp[strlen(argument) - strlen(letter)] = '\0';
		last[0] = '\0';
		name = vch->name;

		for (; *letter != '\0'; letter++)
		{
			if (*letter == '\'' && matches == strlen(vch->name))
			{
				strcat(temp, "r");
				continue;
			}

			if (*letter == 's' && matches == strlen(vch->name))
			{
				matches = 0;
				continue;
			}

			if (matches == strlen(vch->name))
			{
				matches = 0;
			}

			if (*letter == *name)
			{
				matches++;
				name++;

				if (matches == strlen(vch->name))
				{
					strcat(temp, "you");
					last[0] = '\0';
					name = vch->name;
					continue;
				}

				strncat(last, letter, 1);
				continue;
			}

			matches = 0;
			strcat(temp, last);
			strncat(temp, letter, 1);
			last[0] = '\0';
			name = vch->name;
		}

		send_to_char(temp, vch);
		send_to_char("\n\r", vch);
	}
}